

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O2

bool unodb::unlock_and_return(read_critical_section *cs,bool ret)

{
  atomic<long> *paVar1;
  long lVar2;
  optimistic_lock *this;
  __int_type_conflict _Var3;
  __int_type_conflict _Var4;
  
  this = cs->lock;
  _Var3 = (cs->version).version;
  if ((this->read_lock_count).super___atomic_base<long>._M_i < 1) {
    __assert_fail("read_lock_count.load(std::memory_order_acquire) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                  ,0x2f6,"bool unodb::optimistic_lock::check(version_type) const");
  }
  _Var4 = (this->version).version.super___atomic_base<unsigned_long>._M_i;
  if (_Var3 == _Var4) {
    LOCK();
    paVar1 = &this->read_lock_count;
    lVar2 = (paVar1->super___atomic_base<long>)._M_i;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
    UNLOCK();
    if (SBORROW8(lVar2,1) != (paVar1->super___atomic_base<long>)._M_i < 0) {
      __assert_fail("old_value > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./optimistic_lock.hpp"
                    ,0x343,"void unodb::optimistic_lock::dec_read_lock_count() const");
    }
  }
  else {
    optimistic_lock::dec_read_lock_count(this);
  }
  cs->lock = (optimistic_lock *)0x0;
  return _Var3 == _Var4 && ret;
}

Assistant:

[[nodiscard]] inline bool unlock_and_return(
    const unodb::optimistic_lock::read_critical_section& cs,
    bool ret) noexcept {
  return UNODB_DETAIL_LIKELY(cs.try_read_unlock()) ? ret : false;
}